

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

bool __thiscall TgBot::Api::unbanChatMember(Api *this,int64_t chatId,int32_t userId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<bool> oVar2;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  int32_t local_bc;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_b8;
  int64_t local_a0;
  string local_98;
  path_type local_78;
  ptree local_48;
  
  local_b8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = userId;
  local_a0 = chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_b8,2);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_b8,
             (char (*) [8])0x2600ca,&local_a0);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_b8,
             (char (*) [8])"user_id",&local_bc);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unbanChatMember","");
  sendRequest(&local_48,this,&local_98,&local_b8);
  paVar1 = &local_78.m_value.field_2;
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  oVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_b8);
  return (bool)(oVar2.super_type.m_storage & oVar2.super_type.m_initialized & 1);
}

Assistant:

bool Api::unbanChatMember(int64_t chatId, int32_t userId) const {
    vector<HttpReqArg> args;
    args.reserve(2);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("user_id", userId);
    return sendRequest("unbanChatMember", args).get<bool>("", false);
}